

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac.c
# Opt level: O0

int mac_method_hmac_md5_96_hash
              (LIBSSH2_SESSION *session,uchar *buf,uint32_t seqno,uchar *packet,size_t packet_len,
              uchar *addtl,size_t addtl_len,void **abstract)

{
  int iVar1;
  undefined8 local_58;
  uchar temp [16];
  uchar *addtl_local;
  size_t packet_len_local;
  uchar *packet_local;
  uint32_t seqno_local;
  uchar *buf_local;
  LIBSSH2_SESSION *session_local;
  
  iVar1 = mac_method_hmac_md5_hash
                    (session,(uchar *)&local_58,seqno,packet,packet_len,addtl,addtl_len,abstract);
  if (iVar1 == 0) {
    *(undefined8 *)buf = local_58;
    *(undefined4 *)(buf + 8) = temp._0_4_;
  }
  session_local._4_4_ = (uint)(iVar1 != 0);
  return session_local._4_4_;
}

Assistant:

static int
mac_method_hmac_md5_96_hash(LIBSSH2_SESSION * session,
                            unsigned char *buf, uint32_t seqno,
                            const unsigned char *packet,
                            size_t packet_len,
                            const unsigned char *addtl,
                            size_t addtl_len, void **abstract)
{
    unsigned char temp[MD5_DIGEST_LENGTH];

    if(mac_method_hmac_md5_hash(session, temp, seqno, packet, packet_len,
                                addtl, addtl_len, abstract))
        return 1;

    memcpy(buf, (char *) temp, 96 / 8);
    return 0;
}